

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_verror_default(int code,char *fmt,__va_list_tag *ap)

{
  char *__ptr;
  long in_RSI;
  int in_EDI;
  __va_list_tag *unaff_retaddr;
  char *msg;
  int local_4;
  
  if ((in_EDI == 0) && (in_RSI == 0)) {
    local_4 = -1;
  }
  else {
    __ptr = zt_opt_verror_str(ap._4_4_,msg,unaff_retaddr);
    fprintf(_stderr,"%s\n",__ptr);
    local_4 = in_EDI;
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
  }
  return local_4;
}

Assistant:

int
zt_opt_verror_default(int code, char * fmt, va_list ap) {
    char * msg = NULL;

    if (!code && !fmt) {
        /* no code or format equates to calling exit */
        return -1;
    }

    msg = zt_opt_verror_str(code, fmt, ap);
    fprintf(stderr, "%s\n", msg);
    zt_free(msg);
    return code;
}